

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadPololux(POLOLU *pPololu)

{
  int local_1c;
  int id;
  POLOLU *pPololu_local;
  
  local_1c = 0;
  do {
    if ((POLOLU *)addrsPololu[local_1c] == pPololu) {
      bExitPololu[local_1c] = 1;
      WaitForThread(PololuThreadId[local_1c]);
      DeleteCriticalSection(PololuCS + local_1c);
      resPololu[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadPololux(POLOLU* pPololu)
{
	int id = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitPololu[id] = TRUE;
	WaitForThread(PololuThreadId[id]);
	DeleteCriticalSection(&PololuCS[id]);
	resPololu[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}